

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O0

char * nhdp_db_link_status_to_string(nhdp_link *lnk)

{
  nhdp_link_status nVar1;
  nhdp_link *lnk_local;
  
  nVar1 = lnk->status;
  if (nVar1 == NHDP_LINK_PENDING) {
    lnk_local = (nhdp_link *)_LINK_PENDING;
  }
  else if (nVar1 == NHDP_LINK_SYMMETRIC) {
    lnk_local = (nhdp_link *)_LINK_SYMMETRIC;
  }
  else if (nVar1 == NHDP_LINK_HEARD) {
    lnk_local = (nhdp_link *)_LINK_HEARD;
  }
  else {
    lnk_local = (nhdp_link *)_LINK_LOST;
  }
  return (char *)lnk_local;
}

Assistant:

const char *
nhdp_db_link_status_to_string(struct nhdp_link *lnk) {
  switch (lnk->status) {
    case NHDP_LINK_PENDING:
      return _LINK_PENDING;
    case NHDP_LINK_HEARD:
      return _LINK_HEARD;
    case NHDP_LINK_SYMMETRIC:
      return _LINK_SYMMETRIC;
    default:
      return _LINK_LOST;
  }
}